

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxTypeCheck::EmitCommon(FxTypeCheck *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  uint extraout_var_00;
  ExpEmit EVar4;
  
  uVar1 = (*this->left->_vptr_FxExpression[9])();
  uVar2 = (*this->right->_vptr_FxExpression[9])(this->right,build);
  if ((CONCAT44(extraout_var,uVar1) & 0x10100fc0000) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (uVar1 >> 0x10 & 3),uVar1 & 0xffff,uVar1 >> 0x18);
  }
  if (((extraout_var_00 & 0x100) == 0) && ((uVar2 & 0xfc0000) == 0 && (extraout_var_00 & 1) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar2) >> 0x10) & 3),
               uVar2 & 0xffff,uVar2 >> 0x18);
  }
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  VMFunctionBuilder::Emit
            (build,extraout_var_00 & 1 | 0x40,uVar3 & 0xffff,uVar1 & 0xffff,uVar2 & 0xffff);
  EVar4._0_4_ = uVar3 & 0xffff | 0x1030000;
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxTypeCheck::EmitCommon(VMFunctionBuilder *build)
{
	ExpEmit castee = left->Emit(build);
	ExpEmit casttype = right->Emit(build);
	castee.Free(build);
	casttype.Free(build);
	ExpEmit ares(build, REGT_POINTER);
	build->Emit(casttype.Konst ? OP_DYNCAST_K : OP_DYNCAST_R, ares.RegNum, castee.RegNum, casttype.RegNum);
	return ares;
}